

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Minefield_Query_PDU
          (Minefield_Query_PDU *this,EntityIdentifier *MinefieldID,
          EntityIdentifier *RequestingSimulationID,KUINT8 RequestID,MinefieldDataFilter *DF,
          EntityType *MineTypeFilter)

{
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Query_PDU_002220a0;
  (this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar1 = (RequestingSimulationID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ReqID).super_SimulationIdentifier.m_ui16SiteID =
       (RequestingSimulationID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ReqID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->m_ReqID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(RequestingSimulationID->super_SimulationIdentifier).field_0xc;
  this->m_ui8ReqID = RequestID;
  this->m_ui8NumPerimPoints = '\0';
  this->m_ui8Padding1 = '\0';
  this->m_ui8NumSensTyp = '\0';
  (this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__MinefieldDataFilter_00225210;
  (this->m_DataFilter).m_FilterUnion = DF->m_FilterUnion;
  (this->m_MineTypFilter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223cb0;
  KVar2 = MineTypeFilter->m_ui8Domain;
  KVar1 = MineTypeFilter->m_ui16Country;
  KVar3 = MineTypeFilter->m_ui8Category;
  KVar4 = MineTypeFilter->m_ui8SubCategory;
  KVar5 = MineTypeFilter->m_ui8Specific;
  KVar6 = MineTypeFilter->m_ui8Extra;
  (this->m_MineTypFilter).m_ui8EntityKind = MineTypeFilter->m_ui8EntityKind;
  (this->m_MineTypFilter).m_ui8Domain = KVar2;
  (this->m_MineTypFilter).m_ui16Country = KVar1;
  (this->m_MineTypFilter).m_ui8Category = KVar3;
  (this->m_MineTypFilter).m_ui8SubCategory = KVar4;
  (this->m_MineTypFilter).m_ui8Specific = KVar5;
  (this->m_MineTypFilter).m_ui8Extra = KVar6;
  this->m_ui16Padding1 = 0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_bNeedsPadding = false;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '&';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  KVar1 = (MinefieldID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16SiteID =
       (MinefieldID->super_SimulationIdentifier).m_ui16SiteID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar1;
  *(undefined2 *)&(this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(MinefieldID->super_SimulationIdentifier).field_0xc;
  return;
}

Assistant:

Minefield_Query_PDU::Minefield_Query_PDU( const EntityIdentifier & MinefieldID, const EntityIdentifier & RequestingSimulationID,
        KUINT8 RequestID, const MinefieldDataFilter & DF, const EntityType & MineTypeFilter ) :
    m_ReqID( RequestingSimulationID ),
    m_ui8ReqID( RequestID ),
    m_DataFilter( DF ),
    m_MineTypFilter( MineTypeFilter ),
    m_ui8NumPerimPoints( 0 ),
    m_ui8Padding1( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_bNeedsPadding( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = MinefieldQuery_PDU_Type;
    m_ui16PDULength = MINEFIELD_QUERY_PDU_SIZE;
    m_MinefieldID = MinefieldID;
}